

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O1

void ProcessEDMapthing(FMapThing *mt,int recordnum)

{
  undefined8 uVar1;
  Node *pNVar2;
  Node *pNVar3;
  short sVar4;
  Node *pNVar5;
  FDoomEdEntry *pFVar6;
  Node *pNVar7;
  
  InitED();
  pNVar2 = EDThings.Nodes + (EDThings.Size - 1 & recordnum);
  do {
    pNVar5 = pNVar2;
    if ((pNVar5 == (Node *)0x0) || (pNVar5->Next == (Node *)0x1)) {
      pNVar5 = (Node *)0x0;
      break;
    }
    pNVar2 = pNVar5->Next;
  } while ((pNVar5->Pair).Key != recordnum);
  if (pNVar5 == (Node *)0x0) {
    Printf("EDF Mapthing record %d not found\n",recordnum);
    mt->EdNum = 0;
  }
  else {
    mt->thingid = (pNVar5->Pair).Value.tid;
    sVar4 = (short)(pNVar5->Pair).Value.type;
    mt->EdNum = sVar4;
    pNVar3 = DoomEdMap.Nodes + (DoomEdMap.Size - 1 & (int)sVar4);
    do {
      pNVar7 = pNVar3;
      if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
        pNVar7 = (Node *)0x0;
        break;
      }
      pNVar3 = pNVar7->Next;
    } while ((pNVar7->Pair).Key != (int)sVar4);
    pFVar6 = &(pNVar7->Pair).Value;
    if (pNVar7 == (Node *)0x0) {
      pFVar6 = (FDoomEdEntry *)0x0;
    }
    mt->info = pFVar6;
    (mt->pos).Z = (pNVar5->Pair).Value.height;
    uVar1 = *(undefined8 *)((pNVar5->Pair).Value.args + 2);
    *(undefined8 *)mt->args = *(undefined8 *)(pNVar5->Pair).Value.args;
    *(undefined8 *)(mt->args + 2) = uVar1;
    mt->args[4] = (pNVar5->Pair).Value.args[4];
    mt->SkillFilter = (pNVar5->Pair).Value.skillfilter;
    mt->flags = (pNVar5->Pair).Value.flags;
  }
  return;
}

Assistant:

void ProcessEDMapthing(FMapThing *mt, int recordnum)
{
	InitED();

	EDMapthing *emt = EDThings.CheckKey(recordnum);
	if (emt == NULL)
	{
		Printf("EDF Mapthing record %d not found\n", recordnum);
		mt->EdNum = 0;
		return;
	}
	mt->thingid = emt->tid;
	mt->EdNum = emt->type;
	mt->info = DoomEdMap.CheckKey(mt->EdNum);
	mt->pos.Z = emt->height;
	memcpy(mt->args, emt->args, sizeof(mt->args));
	mt->SkillFilter = emt->skillfilter;
	mt->flags = emt->flags;
}